

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  int iVar1;
  OneofDescriptor *this_00;
  char *pcVar2;
  int __c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__s;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldLiteGenerator *this_local;
  
  iVar1 = FieldDescriptor::number((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  WriteIntToUtf16CharSequence(iVar1,output);
  iVar1 = GetExperimentalJavaFieldType
                    ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  __s = output;
  WriteIntToUtf16CharSequence(iVar1,output);
  this_00 = FieldDescriptor::containing_oneof
                      ((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  pcVar2 = OneofDescriptor::index(this_00,(char *)__s,__c);
  WriteIntToUtf16CharSequence((int)pcVar2,output);
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
}